

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O2

void Wlc_WriteAddPos(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  Wlc_Obj_t *pWVar2;
  int *__ptr;
  int iVar3;
  ushort uVar4;
  int Id;
  uint uVar5;
  
  (p->vPos).nSize = 0;
  Id = 1;
  do {
    if (p->iObj <= Id) {
      return;
    }
    pWVar2 = Wlc_NtkObj(p,Id);
    uVar4 = *(ushort *)pWVar2 & 0x3f;
    if ((uVar4 != 1) && (uVar4 != 8)) {
      *(ushort *)pWVar2 = *(ushort *)pWVar2 | 0x200;
      pWVar1 = p->pObjs;
      iVar3 = (p->vPos).nSize;
      if (iVar3 == (p->vPos).nCap) {
        uVar5 = iVar3 * 2;
        if (iVar3 < 0x10) {
          uVar5 = 0x10;
        }
        __ptr = (p->vPos).pArray;
        if (iVar3 < (int)uVar5) {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc((ulong)uVar5 << 2);
          }
          else {
            __ptr = (int *)realloc(__ptr,(ulong)uVar5 << 2);
          }
          (p->vPos).pArray = __ptr;
          if (__ptr == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (p->vPos).nCap = uVar5;
          iVar3 = (p->vPos).nSize;
        }
      }
      else {
        __ptr = (p->vPos).pArray;
      }
      (p->vPos).nSize = iVar3 + 1;
      __ptr[iVar3] = (int)(((long)pWVar2 - (long)pWVar1) / 0x18);
    }
    Id = Id + 1;
  } while( true );
}

Assistant:

void Wlc_WriteAddPos( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i;
    Vec_IntClear( &p->vPos );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type != WLC_OBJ_PI && pObj->Type != WLC_OBJ_MUX )
        {
            pObj->fIsPo = 1;
            Vec_IntPush( &p->vPos, Wlc_ObjId(p, pObj) );
        }
}